

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O1

char * vrna_seq_ungapped(char *seq)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *p;
  char *pcVar4;
  byte *pbVar5;
  
  pcVar4 = (char *)0x0;
  if (seq != (char *)0x0) {
    p = (byte *)strdup(seq);
    pbVar3 = p;
    do {
      pbVar5 = pbVar3 + 1;
      bVar1 = *pbVar3;
      if (((1 < bVar1 - 0x2d) && (bVar1 != 0x5f)) && (bVar1 != 0x7e)) {
        p[(int)pcVar4] = bVar1;
        pcVar4 = (char *)(ulong)((int)pcVar4 + 1);
      }
      pbVar3 = pbVar5;
    } while (*pbVar5 != 0);
    iVar2 = (int)pcVar4;
    pcVar4 = (char *)vrna_realloc(p,iVar2 + 1);
    pcVar4[iVar2] = '\0';
  }
  return pcVar4;
}

Assistant:

PUBLIC char *
vrna_seq_ungapped(const char *seq)
{
  char  *tmp_sequence, *b;
  int   i;

  tmp_sequence = NULL;

  if (seq) {
    tmp_sequence = strdup(seq);

    b = tmp_sequence;
    i = 0;
    do {
      if ((*b == '-') || (*b == '_') || (*b == '~') || (*b == '.'))
        continue;

      tmp_sequence[i] = *b;
      i++;
    } while (*(++b));

    tmp_sequence    = (char *)vrna_realloc(tmp_sequence, (i + 1) * sizeof(char));
    tmp_sequence[i] = '\0';
  }

  return tmp_sequence;
}